

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

void __thiscall CMU462::OSDText::set_text(OSDText *this,int line_id,string *text)

{
  pointer pOVar1;
  
  pOVar1 = (this->lines).super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pOVar1 == (this->lines).
                  super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return;
    }
    if (pOVar1->id == line_id) break;
    pOVar1 = pOVar1 + 1;
  }
  std::__cxx11::string::_M_assign((string *)&pOVar1->text);
  return;
}

Assistant:

void OSDText::set_text(int line_id, string text) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      it->text = text;
      break;
    }
    ++it;
  }
}